

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON *local_28;
  cJSON *c;
  cJSON *newitem_local;
  int which_local;
  cJSON *array_local;
  
  newitem_local._4_4_ = which;
  for (local_28 = array->child; local_28 != (cJSON *)0x0 && 0 < newitem_local._4_4_;
      local_28 = local_28->next) {
    newitem_local._4_4_ = newitem_local._4_4_ + -1;
  }
  if (local_28 == (cJSON *)0x0) {
    cJSON_AddItemToArray(array,newitem);
  }
  else {
    newitem->next = local_28;
    newitem->prev = local_28->prev;
    local_28->prev = newitem;
    if (local_28 == array->child) {
      array->child = newitem;
    }
    else {
      newitem->prev->next = newitem;
    }
  }
  return;
}

Assistant:

void   cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)		{cJSON *c=array->child;while (c && which>0) c=c->next,which--;if (!c) {cJSON_AddItemToArray(array,newitem);return;}
	newitem->next=c;newitem->prev=c->prev;c->prev=newitem;if (c==array->child) array->child=newitem; else newitem->prev->next=newitem;}